

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O0

void __thiscall
QCompleterItemDelegate::paint
          (QCompleterItemDelegate *this,QPainter *p,QStyleOptionViewItem *opt,QModelIndex *idx)

{
  bool bVar1;
  QAbstractItemView *in_RCX;
  QModelIndex *in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionViewItem optCopy;
  QStyleOptionViewItem *in_stack_fffffffffffffed8;
  QStyleOptionViewItem *in_stack_fffffffffffffee0;
  QStyleOptionViewItem *this_00;
  QPainter *in_stack_ffffffffffffff10;
  QStyledItemDelegate *in_stack_ffffffffffffff18;
  QStyleOptionViewItem local_d8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_d8.showDecorationSelected = true;
  QAbstractItemView::currentIndex(in_RCX);
  bVar1 = ::operator==((QModelIndex *)in_stack_fffffffffffffee0,
                       (QModelIndex *)in_stack_fffffffffffffed8);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=(&local_d8.super_QStyleOption.state,State_HasFocus);
  }
  this_00 = &local_d8;
  QStyledItemDelegate::paint(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_RDI,in_RSI);
  QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void paint(QPainter *p, const QStyleOptionViewItem& opt, const QModelIndex& idx) const override {
        QStyleOptionViewItem optCopy = opt;
        optCopy.showDecorationSelected = true;
        if (view->currentIndex() == idx)
            optCopy.state |= QStyle::State_HasFocus;
        QStyledItemDelegate::paint(p, optCopy, idx);
    }